

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

size_t mbedtls_mpi_lsb(mbedtls_mpi *X)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  lVar2 = 0;
  while( true ) {
    if ((ulong)X->n * 0x40 + lVar2 == 0) {
      return 0;
    }
    uVar1 = *(ulong *)((long)X->p + lVar3);
    if (uVar1 != 0) break;
    lVar2 = lVar2 + -0x40;
    lVar3 = lVar3 + 8;
  }
  lVar3 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
    }
  }
  return lVar3 - lVar2;
}

Assistant:

size_t mbedtls_mpi_lsb(const mbedtls_mpi *X)
{
    size_t i;
    MBEDTLS_INTERNAL_VALIDATE_RET(X != NULL, 0);

#if defined(__has_builtin)
#if (MBEDTLS_MPI_UINT_MAX == UINT_MAX) && __has_builtin(__builtin_ctz)
    #define mbedtls_mpi_uint_ctz __builtin_ctz
#elif (MBEDTLS_MPI_UINT_MAX == ULONG_MAX) && __has_builtin(__builtin_ctzl)
    #define mbedtls_mpi_uint_ctz __builtin_ctzl
#elif (MBEDTLS_MPI_UINT_MAX == ULLONG_MAX) && __has_builtin(__builtin_ctzll)
    #define mbedtls_mpi_uint_ctz __builtin_ctzll
#endif
#endif

#if defined(mbedtls_mpi_uint_ctz)
    for (i = 0; i < X->n; i++) {
        if (X->p[i] != 0) {
            return i * biL + mbedtls_mpi_uint_ctz(X->p[i]);
        }
    }
#else
    size_t count = 0;
    for (i = 0; i < X->n; i++) {
        for (size_t j = 0; j < biL; j++, count++) {
            if (((X->p[i] >> j) & 1) != 0) {
                return count;
            }
        }
    }
#endif

    return 0;
}